

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCacheManager *pcVar3;
  bool bVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  string currentStart;
  string message;
  string srcList;
  ostringstream err;
  undefined1 auStack_208 [8];
  string local_200;
  long *local_1e0 [2];
  long local_1d0 [2];
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar5 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)local_1c0,pcVar5,(allocator *)local_1a0);
  std::__cxx11::string::append((char *)local_1c0);
  bVar4 = cmsys::SystemTools::FileExists((char *)local_1c0[0]);
  if (bVar4) {
    pcVar3 = this->CacheManager;
    pcVar1 = local_1a0 + 0x10;
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_HOME_DIRECTORY","");
    pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar3,(string *)local_1a0);
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (pcVar5 == (char *)0x0) {
      iVar8 = 0;
    }
    else {
      pcVar3 = this->CacheManager;
      paVar2 = &local_200.field_2;
      local_200._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,"CMAKE_HOME_DIRECTORY","");
      pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar3,&local_200);
      std::__cxx11::string::string((string *)local_1a0,pcVar5,(allocator *)local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append(local_1a0);
      pcVar5 = cmState::GetSourceDirectory(this->State);
      std::__cxx11::string::string((string *)&local_200,pcVar5,(allocator *)local_1e0);
      std::__cxx11::string::append((char *)&local_200);
      bVar4 = cmsys::SystemTools::SameFile((string *)local_1a0,&local_200);
      if (!bVar4) {
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"The source \"","");
        std::__cxx11::string::_M_append((char *)local_1e0,(ulong)local_200._M_dataplus._M_p);
        std::__cxx11::string::append((char *)local_1e0);
        std::__cxx11::string::_M_append((char *)local_1e0,local_1a0._0_8_);
        std::__cxx11::string::append((char *)local_1e0);
        std::__cxx11::string::append((char *)local_1e0);
        cmSystemTools::Error((char *)local_1e0[0],(char *)0x0,(char *)0x0,(char *)0x0);
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a0._0_8_ != pcVar1) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      iVar8 = (uint)bVar4 + (uint)bVar4 * 2 + -2;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    pcVar5 = cmState::GetSourceDirectory(this->State);
    std::__cxx11::string::string((string *)&local_200,pcVar5,(allocator *)local_1e0);
    bVar4 = cmsys::SystemTools::FileIsDirectory(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"The source directory \"",0x16);
      pcVar5 = cmState::GetSourceDirectory(this->State);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x68);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,sVar6);
      }
      lVar7 = 0x2d;
      pcVar5 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      pcVar5 = cmState::GetSourceDirectory(this->State);
      bVar4 = cmsys::SystemTools::FileExists(pcVar5);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"The source directory \"",0x16);
        pcVar5 = cmState::GetSourceDirectory(this->State);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x68);
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,sVar6);
        }
        lVar7 = 0x1e;
        pcVar5 = "\" is a file, not a directory.\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"The source directory \"",0x16);
        pcVar5 = cmState::GetSourceDirectory(this->State);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x68);
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,sVar6);
        }
        lVar7 = 0x12;
        pcVar5 = "\" does not exist.\n";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "Specify --help for usage, or press the help button on the CMake GUI.",0x44);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_200._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    iVar8 = -2;
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return iVar8;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if(!cmSystemTools::FileExists(srcList.c_str()))
    {
    std::ostringstream err;
    if(cmSystemTools::FileIsDirectory(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
      }
    else if(cmSystemTools::FileExists(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
      }
    else
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
      }
    err << "Specify --help for usage, or press the help button on the CMake "
      "GUI.";
    cmSystemTools::Error(err.str().c_str());
    return -2;
    }

  // do a sanity check on some values
  if(this->CacheManager->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"))
    {
    std::string cacheStart =
      this->CacheManager->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if(!cmSystemTools::SameFile(cacheStart, currentStart))
      {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    return 0;
    }
  return 1;
}